

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

bool __thiscall sf::Font::loadFromStream(Font *this,InputStream *stream)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  undefined8 uVar4;
  EVP_PKEY_CTX *in_RSI;
  Font *in_RDI;
  FT_Stroker stroker;
  FT_Face_conflict face;
  FT_Open_Args args;
  FT_StreamRec *rec;
  FT_Library library;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  byte bVar5;
  allocator<char> in_stack_ffffffffffffff67;
  string local_98 [32];
  void *local_78;
  void *local_70;
  undefined4 local_68 [8];
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 *local_28;
  void *local_20;
  EVP_PKEY_CTX *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  cleanup(in_RDI,in_RSI);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 1;
  in_RDI->m_refCount = piVar2;
  iVar1 = FT_Init_FreeType(&local_20);
  if (iVar1 == 0) {
    in_RDI->m_library = local_20;
    (**(code **)(*(long *)local_18 + 0x18))();
    local_28 = (undefined8 *)operator_new(0x50);
    memset(local_28,0,0x50);
    *local_28 = 0;
    uVar4 = (**(code **)(*(long *)local_18 + 0x28))();
    local_28[1] = uVar4;
    local_28[2] = 0;
    local_28[3] = local_18;
    local_28[5] = anon_unknown.dwarf_581d0::read;
    local_28[6] = anon_unknown.dwarf_581d0::close;
    local_68[0] = 2;
    local_48 = local_28;
    local_40 = 0;
    iVar1 = FT_Open_Face(in_RDI->m_library,local_68,0,&local_70);
    if (iVar1 == 0) {
      iVar1 = FT_Stroker_New(in_RDI->m_library,&local_78);
      if (iVar1 == 0) {
        iVar1 = FT_Select_Charmap(local_70,0x756e6963);
        if (iVar1 == 0) {
          in_RDI->m_stroker = local_78;
          in_RDI->m_face = local_70;
          in_RDI->m_streamRec = local_28;
          bVar5 = 0;
          if (*(long *)((long)local_70 + 0x28) == 0) {
            std::__cxx11::string::string(local_98);
          }
          else {
            std::allocator<char>::allocator();
            bVar5 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff67,CONCAT16(1,in_stack_ffffffffffffff60)),
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          }
          std::__cxx11::string::operator=((string *)&in_RDI->m_info,local_98);
          std::__cxx11::string::~string(local_98);
          if ((bVar5 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
          }
          local_1 = true;
        }
        else {
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "Failed to load font from stream (failed to set the Unicode character set)"
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          FT_Done_Face(local_70);
          FT_Stroker_Done(local_78);
          if (local_28 != (undefined8 *)0x0) {
            operator_delete(local_28,0x50);
          }
          local_1 = false;
        }
      }
      else {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Failed to load font from stream (failed to create the stroker)");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        FT_Done_Face(local_70);
        if (local_28 != (undefined8 *)0x0) {
          operator_delete(local_28,0x50);
        }
        local_1 = false;
      }
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,
                               "Failed to load font from stream (failed to create the font face)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      if (local_28 != (undefined8 *)0x0) {
        operator_delete(local_28,0x50);
      }
      local_1 = false;
    }
  }
  else {
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,
                             "Failed to load font from stream (failed to initialize FreeType)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Font::loadFromStream(InputStream& stream)
{
    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font from stream (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Prepare a wrapper for our stream, that we'll pass to FreeType callbacks
    FT_StreamRec* rec = new FT_StreamRec;
    std::memset(rec, 0, sizeof(*rec));
    rec->base               = NULL;
    rec->size               = static_cast<unsigned long>(stream.getSize());
    rec->pos                = 0;
    rec->descriptor.pointer = &stream;
    rec->read               = &read;
    rec->close              = &close;

    // Setup the FreeType callbacks that will read our stream
    FT_Open_Args args;
    args.flags  = FT_OPEN_STREAM;
    args.stream = rec;
    args.driver = 0;

    // Load the new font face from the specified stream
    FT_Face face;
    if (FT_Open_Face(static_cast<FT_Library>(m_library), &args, 0, &face) != 0)
    {
        err() << "Failed to load font from stream (failed to create the font face)" << std::endl;
        delete rec;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font from stream (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        delete rec;
        return false;
    }

    // Select the Unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font from stream (failed to set the Unicode character set)" << std::endl;
        FT_Done_Face(face);
        FT_Stroker_Done(stroker);
        delete rec;
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;
    m_streamRec = rec;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;
}